

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9_level_stats.cc
# Opt level: O1

Vp9Level __thiscall vp9_parser::Vp9LevelStats::GetLevel(Vp9LevelStats *this)

{
  Vp9Level VVar1;
  long lVar2;
  bool bVar3;
  Vp9Level VVar4;
  Vp9Level VVar5;
  long *plVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int i_5;
  int i;
  long lVar10;
  long lVar11;
  int *piVar12;
  undefined1 *puVar13;
  double *pdVar14;
  double dVar15;
  
  lVar11 = this->max_luma_picture_size_;
  lVar2 = this->max_luma_picture_breadth_;
  lVar10 = this->max_luma_size_;
  dVar15 = GetAverageBitRate(this);
  plVar6 = (long *)(Vp9LevelTable + 8);
  lVar8 = 0;
  do {
    if ((double)lVar10 <=
        (double)*plVar6 * (this->max_luma_sample_rate_grace_percent_ / 100.0 + 1.0)) {
      VVar1 = *(Vp9Level *)(plVar6 + -1);
      VVar5 = VVar1;
      if ((int)VVar1 < 1) {
        VVar5 = LEVEL_UNKNOWN;
      }
      iVar7 = (int)lVar8;
      if ((int)VVar1 < 1) {
        iVar7 = 0;
      }
      goto LAB_00113651;
    }
    lVar8 = lVar8 + 1;
    plVar6 = plVar6 + 9;
  } while (lVar8 != 0xe);
  VVar5 = LEVEL_UNKNOWN;
  iVar7 = 0;
LAB_00113651:
  plVar6 = (long *)(Vp9LevelTable + 0x10);
  lVar10 = 0;
  do {
    if (lVar11 <= *plVar6) {
      VVar1 = *(Vp9Level *)(plVar6 + -2);
      VVar4 = VVar5;
      if ((int)VVar5 <= (int)VVar1) {
        VVar4 = VVar1;
      }
      bVar3 = (int)VVar5 < (int)VVar1;
      VVar5 = VVar4;
      if (bVar3) {
        iVar7 = (int)lVar10;
      }
      break;
    }
    lVar10 = lVar10 + 1;
    plVar6 = plVar6 + 9;
  } while (lVar10 != 0xe);
  puVar13 = Vp9LevelTable;
  lVar11 = 0;
  do {
    if (lVar2 <= (long)*(undefined8 *)((long)puVar13 + 0x18)) {
      VVar1 = *(Vp9Level *)puVar13;
      VVar4 = VVar5;
      if ((int)VVar5 <= (int)VVar1) {
        VVar4 = VVar1;
      }
      bVar3 = (int)VVar5 < (int)VVar1;
      VVar5 = VVar4;
      if (bVar3) {
        iVar7 = (int)lVar11;
      }
      break;
    }
    lVar11 = lVar11 + 1;
    puVar13 = (undefined1 *)((long)puVar13 + 0x48);
  } while (lVar11 != 0xe);
  pdVar14 = (double *)(Vp9LevelTable + 0x20);
  lVar11 = 0;
  do {
    if (dVar15 <= *pdVar14) {
      VVar1 = *(Vp9Level *)(pdVar14 + -4);
      VVar4 = VVar5;
      if ((int)VVar5 <= (int)VVar1) {
        VVar4 = VVar1;
      }
      bVar3 = (int)VVar5 < (int)VVar1;
      VVar5 = VVar4;
      if (bVar3) {
        iVar7 = (int)lVar11;
      }
      break;
    }
    lVar11 = lVar11 + 1;
    pdVar14 = pdVar14 + 9;
  } while (lVar11 != 0xe);
  puVar13 = Vp9LevelTable;
  lVar11 = 0;
  do {
    if ((0.0 < *(double *)((long)puVar13 + 0x28)) &&
       ((double)this->max_cpb_size_ / 125.0 <= *(double *)((long)puVar13 + 0x28))) {
      VVar1 = *(Vp9Level *)puVar13;
      VVar4 = VVar5;
      if ((int)VVar5 <= (int)VVar1) {
        VVar4 = VVar1;
      }
      bVar3 = (int)VVar5 < (int)VVar1;
      VVar5 = VVar4;
      if (bVar3) {
        iVar7 = (int)lVar11;
      }
      break;
    }
    lVar11 = lVar11 + 1;
    puVar13 = (undefined1 *)((long)puVar13 + 0x48);
  } while (lVar11 != 0xe);
  puVar13 = Vp9LevelTable;
  lVar11 = 0;
  do {
    if (this->max_column_tiles_ <= (int)*(Vp9Level *)((long)puVar13 + 0x38)) {
      VVar1 = *(Vp9Level *)puVar13;
      VVar4 = VVar5;
      if ((int)VVar5 <= (int)VVar1) {
        VVar4 = VVar1;
      }
      bVar3 = (int)VVar5 < (int)VVar1;
      VVar5 = VVar4;
      if (bVar3) {
        iVar7 = (int)lVar11;
      }
      break;
    }
    lVar11 = lVar11 + 1;
    puVar13 = (undefined1 *)((long)puVar13 + 0x48);
  } while (lVar11 != 0xe);
  piVar12 = (int *)(Vp9LevelTable + 0x40);
  lVar11 = 0;
  do {
    if (this->max_frames_refreshed_ <= *piVar12) {
      VVar1 = piVar12[-0x10];
      VVar4 = VVar5;
      if ((int)VVar5 <= (int)VVar1) {
        VVar4 = VVar1;
      }
      bVar3 = (int)VVar5 < (int)VVar1;
      VVar5 = VVar4;
      if (bVar3) {
        iVar7 = (int)lVar11;
      }
      break;
    }
    lVar11 = lVar11 + 1;
    piVar12 = piVar12 + 0x12;
  } while (lVar11 != 0xe);
  iVar9 = -1;
  if (this->minimum_altref_distance != 0x7fffffff) {
    iVar9 = this->minimum_altref_distance;
  }
  if (iVar9 < *(int *)(Vp9LevelTable + (long)iVar7 * 0x48 + 0x3c)) {
    VVar5 = LEVEL_UNKNOWN;
  }
  if ((double)this->total_uncompressed_bits_ / (double)(this->total_compressed_size_ << 3) <
      *(double *)(Vp9LevelTable + (long)iVar7 * 0x48 + 0x30)) {
    VVar5 = LEVEL_UNKNOWN;
  }
  return VVar5;
}

Assistant:

Vp9Level Vp9LevelStats::GetLevel() const {
  const int64_t max_luma_sample_rate = GetMaxLumaSampleRate();
  const int64_t max_luma_picture_size = GetMaxLumaPictureSize();
  const int64_t max_luma_picture_breadth = GetMaxLumaPictureBreadth();
  const double average_bitrate = GetAverageBitRate();
  const double max_cpb_size = GetMaxCpbSize();
  const double compresion_ratio = GetCompressionRatio();
  const int max_column_tiles = GetMaxColumnTiles();
  const int min_altref_distance = GetMinimumAltrefDistance();
  const int max_ref_frames = GetMaxReferenceFrames();

  int level_index = 0;
  Vp9Level max_level = LEVEL_UNKNOWN;
  const double grace_multiplier =
      max_luma_sample_rate_grace_percent_ / 100.0 + 1.0;
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_luma_sample_rate <=
        Vp9LevelTable[i].max_luma_sample_rate * grace_multiplier) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_luma_picture_size <= Vp9LevelTable[i].max_luma_picture_size) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_luma_picture_breadth <= Vp9LevelTable[i].max_luma_picture_breadth) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (average_bitrate <= Vp9LevelTable[i].average_bitrate) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    // Only check CPB size for levels that are defined.
    if (Vp9LevelTable[i].max_cpb_size > 0 &&
        max_cpb_size <= Vp9LevelTable[i].max_cpb_size) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }
  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_column_tiles <= Vp9LevelTable[i].max_tiles) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }

  for (int i = 0; i < kNumVp9Levels; ++i) {
    if (max_ref_frames <= Vp9LevelTable[i].max_ref_frames) {
      if (max_level < Vp9LevelTable[i].level) {
        max_level = Vp9LevelTable[i].level;
        level_index = i;
      }
      break;
    }
  }

  // Check if the current level meets the minimum altref distance requirement.
  // If not, set to unknown level as we can't move up a level as the minimum
  // altref distance get farther apart and we can't move down a level as we are
  // already at the minimum level for all the other requirements.
  if (min_altref_distance < Vp9LevelTable[level_index].min_altref_distance)
    max_level = LEVEL_UNKNOWN;

  // The minimum compression ratio has the same behavior as minimum altref
  // distance.
  if (compresion_ratio < Vp9LevelTable[level_index].compresion_ratio)
    max_level = LEVEL_UNKNOWN;
  return max_level;
}